

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<int_*>::TPZVec(TPZVec<int_*> *this,int64_t size)

{
  int **ppiVar1;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_016492e8;
  this->fStore = (int **)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,"TPZVec<int *>::TPZVec(const int64_t) [T = int *]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      ppiVar1 = (int **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
      this->fStore = ppiVar1;
    }
    this->fNElements = size;
    this->fNAlloc = size;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}